

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

void __thiscall sqlite::Connection::Stmt::reset(Stmt *this)

{
  int sqlite_error_code;
  Logic_error *this_00;
  char *pcVar1;
  allocator local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sqlite_error_code = sqlite3_reset(this->stmt_);
  if (sqlite_error_code == 0) {
    return;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  s_abi_cxx11_(&local_60,"Error resetting statement: ",0x1b);
  pcVar1 = (char *)sqlite3_errmsg(this->db_);
  std::operator+(&local_40,&local_60,pcVar1);
  pcVar1 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
  Logic_error::Logic_error(this_00,&local_40,&local_80,sqlite_error_code,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::Stmt::reset()
    {
        int status = sqlite3_reset(stmt_);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error resetting statement: "s +
                sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }